

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_method_process.cpp
# Opt level: O0

void __thiscall
sc_core::sc_method_process::resume_process
          (sc_method_process *this,sc_descendant_inclusion_info descendants)

{
  int iVar1;
  undefined4 extraout_var;
  size_type sVar2;
  const_reference ppsVar3;
  sc_method_handle psVar4;
  sc_method_process *psVar5;
  int in_ESI;
  sc_method_process *in_RDI;
  sc_process_b *child_p;
  int child_i;
  int child_n;
  vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *children;
  char *in_stack_000001a0;
  char *in_stack_000001a8;
  sc_process_b *in_stack_000001b0;
  sc_method_handle in_stack_ffffffffffffffb8;
  sc_simcontext *in_stack_ffffffffffffffc0;
  sc_simcontext *in_stack_ffffffffffffffd8;
  undefined1 skip_timeout;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  skip_timeout = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  if (in_ESI == 1) {
    iVar1 = (*(in_RDI->super_sc_process_b).super_sc_object._vptr_sc_object[5])();
    sVar2 = std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::size
                      ((vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)
                       CONCAT44(extraout_var,iVar1));
    in_stack_ffffffffffffffe4 = (int)sVar2;
    for (in_stack_ffffffffffffffe0 = 0;
        skip_timeout = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38),
        in_stack_ffffffffffffffe0 < in_stack_ffffffffffffffe4;
        in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1) {
      ppsVar3 = std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::operator[]
                          ((vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)
                           CONCAT44(extraout_var,iVar1),(long)in_stack_ffffffffffffffe0);
      if (*ppsVar3 == (sc_object *)0x0) {
        in_stack_ffffffffffffffc0 = (sc_simcontext *)0x0;
      }
      else {
        in_stack_ffffffffffffffc0 =
             (sc_simcontext *)
             __dynamic_cast(*ppsVar3,&sc_object::typeinfo,&sc_process_b::typeinfo,0);
      }
      in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffc0;
      if (in_stack_ffffffffffffffc0 != (sc_simcontext *)0x0) {
        (*(code *)in_stack_ffffffffffffffc0->m_object_manager[1].m_instance_table._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left)(in_stack_ffffffffffffffc0,1);
      }
    }
  }
  if ((((sc_allow_process_control_corners & 1) == 0) &&
      (((in_RDI->super_sc_process_b).m_state & 1U) != 0)) &&
     (((in_RDI->super_sc_process_b).m_state & 4U) != 0)) {
    (in_RDI->super_sc_process_b).m_state = (in_RDI->super_sc_process_b).m_state & 0xfffffffb;
    sc_process_b::report_error(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
  }
  (in_RDI->super_sc_process_b).m_state = (in_RDI->super_sc_process_b).m_state & 0xfffffffb;
  if (((in_RDI->super_sc_process_b).m_state & 2U) != 0) {
    (in_RDI->super_sc_process_b).m_state = (in_RDI->super_sc_process_b).m_state & 0xfffffffd;
    psVar4 = next_runnable(in_RDI);
    if ((psVar4 == (sc_method_handle)0x0) &&
       (psVar5 = (sc_method_process *)sc_get_current_process_b(), psVar5 != in_RDI)) {
      sc_object::simcontext((sc_object *)in_RDI);
      sc_simcontext::push_runnable_method(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      sc_process_b::remove_dynamic_events
                ((sc_process_b *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (bool)skip_timeout);
    }
  }
  return;
}

Assistant:

void sc_method_process::resume_process(
    sc_descendant_inclusion_info descendants )
{

    // IF NEEDED PROPOGATE THE RESUME REQUEST THROUGH OUR DESCENDANTS:

    if ( descendants == SC_INCLUDE_DESCENDANTS )
    {
        const std::vector<sc_object*>& children = get_child_objects();
        int                            child_n  = children.size();

        for ( int child_i = 0; child_i < child_n; child_i++ )
        {
            sc_process_b* child_p = dynamic_cast<sc_process_b*>(children[child_i]);
            if ( child_p ) child_p->resume_process(descendants);
        }
    }


    // BY DEFAULT THE CORNER CASE IS AN ERROR:

    if ( !sc_allow_process_control_corners && (m_state & ps_bit_disabled) &&
         (m_state & ps_bit_suspended) )
    {
        m_state = m_state & ~ps_bit_suspended;
        report_error( SC_ID_PROCESS_CONTROL_CORNER_CASE_,
                      "call to resume() on a disabled suspended method" );
        // may continue, if suppressed
    }

    // CLEAR THE SUSPENDED BIT:

    m_state = m_state & ~ps_bit_suspended;

    // RESUME OBJECT INSTANCE:
    //
    // If this is not a self-resume and the method is ready to run then
    // put it on the runnable queue.

    if ( m_state & ps_bit_ready_to_run )
    {
	m_state = m_state & ~ps_bit_ready_to_run;
	if ( next_runnable() == 0 &&
	   ( sc_get_current_process_b() != dynamic_cast<sc_process_b*>(this) ) )
        {
	    simcontext()->push_runnable_method(this);
	    remove_dynamic_events();
	}
    }
}